

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArealObjectStatePdu.cpp
# Opt level: O2

void __thiscall
DIS::ArealObjectStatePdu::unmarshal(ArealObjectStatePdu *this,DataStream *dataStream)

{
  ulong uVar1;
  Vector3Double x;
  Vector3Double VStack_48;
  
  SyntheticEnvironmentFamilyPdu::unmarshal(&this->super_SyntheticEnvironmentFamilyPdu,dataStream);
  EntityID::unmarshal(&this->_objectID,dataStream);
  EntityID::unmarshal(&this->_referencedObjectID,dataStream);
  DataStream::operator>>(dataStream,&this->_updateNumber);
  DataStream::operator>>(dataStream,&this->_forceID);
  DataStream::operator>>(dataStream,&this->_modifications);
  EntityType::unmarshal(&this->_objectType,dataStream);
  SixByteChunk::unmarshal(&this->_objectAppearance,dataStream);
  DataStream::operator>>(dataStream,&this->_numberOfPoints);
  SimulationAddress::unmarshal(&this->_requesterID,dataStream);
  SimulationAddress::unmarshal(&this->_receivingID,dataStream);
  std::vector<DIS::Vector3Double,_std::allocator<DIS::Vector3Double>_>::clear
            (&this->_objectLocation);
  for (uVar1 = 0; uVar1 < this->_numberOfPoints; uVar1 = uVar1 + 1) {
    Vector3Double::Vector3Double(&VStack_48);
    Vector3Double::unmarshal(&VStack_48,dataStream);
    std::vector<DIS::Vector3Double,_std::allocator<DIS::Vector3Double>_>::push_back
              (&this->_objectLocation,&VStack_48);
    Vector3Double::~Vector3Double(&VStack_48);
  }
  return;
}

Assistant:

void ArealObjectStatePdu::unmarshal(DataStream& dataStream)
{
    SyntheticEnvironmentFamilyPdu::unmarshal(dataStream); // unmarshal information in superclass first
    _objectID.unmarshal(dataStream);
    _referencedObjectID.unmarshal(dataStream);
    dataStream >> _updateNumber;
    dataStream >> _forceID;
    dataStream >> _modifications;
    _objectType.unmarshal(dataStream);
    _objectAppearance.unmarshal(dataStream);
    dataStream >> _numberOfPoints;
    _requesterID.unmarshal(dataStream);
    _receivingID.unmarshal(dataStream);

     _objectLocation.clear();
     for(size_t idx = 0; idx < _numberOfPoints; idx++)
     {
        Vector3Double x;
        x.unmarshal(dataStream);
        _objectLocation.push_back(x);
     }
}